

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O0

void helper_neon_qunzip8_aarch64(void *vd,void *vm)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  uint64_t m1;
  uint64_t m0;
  uint64_t d1;
  uint64_t d0;
  uint64_t zm1;
  uint64_t zm0;
  uint64_t zd1;
  uint64_t zd0;
  uint64_t *rm;
  uint64_t *rd;
  void *vm_local;
  void *vd_local;
  
  uVar1 = *vd;
  uVar2 = *(ulong *)((long)vd + 8);
  uVar3 = *vm;
  uVar4 = *(ulong *)((long)vm + 8);
  *(ulong *)vm = uVar1 >> 8 & 0xff | (uVar1 >> 0x18 & 0xff) << 8 | (uVar1 >> 0x28 & 0xff) << 0x10 |
                 (uVar1 >> 0x38) << 0x18 | (uVar2 >> 8 & 0xff) << 0x20 |
                 (uVar2 >> 0x18 & 0xff) << 0x28 | (uVar2 >> 0x28 & 0xff) << 0x30 |
                 uVar2 & 0xff00000000000000;
  *(ulong *)((long)vm + 8) =
       uVar3 >> 8 & 0xff | (uVar3 >> 0x18 & 0xff) << 8 | (uVar3 >> 0x28 & 0xff) << 0x10 |
       (uVar3 >> 0x38) << 0x18 | (uVar4 >> 8 & 0xff) << 0x20 | (uVar4 >> 0x18 & 0xff) << 0x28 |
       (uVar4 >> 0x28 & 0xff) << 0x30 | uVar4 & 0xff00000000000000;
  *(ulong *)vd = uVar1 & 0xff | (uVar1 >> 0x10 & 0xff) << 8 | (uVar1 >> 0x20 & 0xff) << 0x10 |
                 (uVar1 >> 0x30 & 0xff) << 0x18 | (uVar2 & 0xff) << 0x20 |
                 (uVar2 >> 0x10 & 0xff) << 0x28 | (uVar2 >> 0x20 & 0xff) << 0x30 |
                 (uVar2 >> 0x30) << 0x38;
  *(ulong *)((long)vd + 8) =
       uVar3 & 0xff | (uVar3 >> 0x10 & 0xff) << 8 | (uVar3 >> 0x20 & 0xff) << 0x10 |
       (uVar3 >> 0x30 & 0xff) << 0x18 | (uVar4 & 0xff) << 0x20 | (uVar4 >> 0x10 & 0xff) << 0x28 |
       (uVar4 >> 0x20 & 0xff) << 0x30 | (uVar4 >> 0x30) << 0x38;
  return;
}

Assistant:

void HELPER(neon_qunzip8)(void *vd, void *vm)
{
    uint64_t *rd = vd, *rm = vm;
    uint64_t zd0 = rd[0], zd1 = rd[1];
    uint64_t zm0 = rm[0], zm1 = rm[1];

    uint64_t d0 = ELEM(zd0, 0, 8) | (ELEM(zd0, 2, 8) << 8)
        | (ELEM(zd0, 4, 8) << 16) | (ELEM(zd0, 6, 8) << 24)
        | (ELEM(zd1, 0, 8) << 32) | (ELEM(zd1, 2, 8) << 40)
        | (ELEM(zd1, 4, 8) << 48) | (ELEM(zd1, 6, 8) << 56);
    uint64_t d1 = ELEM(zm0, 0, 8) | (ELEM(zm0, 2, 8) << 8)
        | (ELEM(zm0, 4, 8) << 16) | (ELEM(zm0, 6, 8) << 24)
        | (ELEM(zm1, 0, 8) << 32) | (ELEM(zm1, 2, 8) << 40)
        | (ELEM(zm1, 4, 8) << 48) | (ELEM(zm1, 6, 8) << 56);
    uint64_t m0 = ELEM(zd0, 1, 8) | (ELEM(zd0, 3, 8) << 8)
        | (ELEM(zd0, 5, 8) << 16) | (ELEM(zd0, 7, 8) << 24)
        | (ELEM(zd1, 1, 8) << 32) | (ELEM(zd1, 3, 8) << 40)
        | (ELEM(zd1, 5, 8) << 48) | (ELEM(zd1, 7, 8) << 56);
    uint64_t m1 = ELEM(zm0, 1, 8) | (ELEM(zm0, 3, 8) << 8)
        | (ELEM(zm0, 5, 8) << 16) | (ELEM(zm0, 7, 8) << 24)
        | (ELEM(zm1, 1, 8) << 32) | (ELEM(zm1, 3, 8) << 40)
        | (ELEM(zm1, 5, 8) << 48) | (ELEM(zm1, 7, 8) << 56);

    rm[0] = m0;
    rm[1] = m1;
    rd[0] = d0;
    rd[1] = d1;
}